

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  ulong uVar4;
  long lVar5;
  num_writer f;
  int num_digits;
  _Alloc_hider _Var6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  string_view prefix;
  string groups;
  undefined4 uStack_54;
  undefined7 uStack_47;
  string local_40;
  
  grouping_impl<char>(&local_40,(locale_ref)(this->writer->locale_).locale_);
  if (local_40._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar2 = this->specs->thousands;
    if (cVar2 == '\0') {
      on_dec(this);
    }
    else {
      uVar4 = this->abs_value;
      lVar5 = 0x3f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      uVar10 = ((uint)lVar5 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
      iVar11 = (uVar10 + 1) -
               (uint)(uVar4 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                        (ulong)uVar10 * 8));
      pcVar1 = local_40._M_dataplus._M_p + local_40._M_string_length;
      iVar12 = (int)local_40._M_string_length + iVar11;
      _Var6._M_p = local_40._M_dataplus._M_p;
      iVar8 = iVar11;
      do {
        cVar3 = *_Var6._M_p;
        iVar9 = iVar8 - cVar3;
        pcVar7 = _Var6._M_p;
        num_digits = iVar11;
        if ((iVar9 == 0 || iVar8 < cVar3) || ((byte)(cVar3 + 0x81U) < 0x82)) break;
        iVar11 = iVar11 + 1;
        _Var6._M_p = _Var6._M_p + 1;
        local_40._M_string_length = local_40._M_string_length - 1;
        pcVar7 = pcVar1;
        iVar8 = iVar9;
        num_digits = iVar12;
      } while (local_40._M_string_length != 0);
      if (pcVar7 == pcVar1) {
        num_digits = (iVar8 + -1) / (int)pcVar1[-1] + num_digits;
      }
      f._12_4_ = uStack_54;
      f.size = num_digits;
      f._25_7_ = uStack_47;
      f.sep = cVar2;
      f.abs_value = uVar4;
      f.groups = &local_40;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      basic_writer<duckdb_fmt::v6::buffer_range<char>>::
      write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<long_long,duckdb_fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this->writer,num_digits,prefix,
                 *this->specs,f);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }